

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

Vec_Ptr_t * Bac_PtrTransformBox(Vec_Ptr_t *vBox,Vec_Ptr_t *vGatesNames)

{
  Vec_Ptr_t *vBox_00;
  char *pcVar1;
  int i;
  
  vBox_00 = Vec_PtrAllocExact(vBox->nSize);
  for (i = 0; i < vBox->nSize; i = i + 1) {
    pcVar1 = (char *)Vec_PtrEntry(vBox,i);
    pcVar1 = Abc_UtilStrsav(pcVar1);
    Vec_PtrPush(vBox_00,pcVar1);
  }
  if (vGatesNames != (Vec_Ptr_t *)0x0) {
    Bac_PtrUpdateBox(vBox_00,vGatesNames);
  }
  return vBox_00;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformBox( Vec_Ptr_t * vBox, Vec_Ptr_t * vGatesNames )
{
    char * pName; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vBox) );
    Vec_PtrForEachEntry( char *, vBox, pName, i )
        Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    if ( vGatesNames )
        Bac_PtrUpdateBox( vNew, vGatesNames );
    return vNew;
}